

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::has_crlf(char *s)

{
  char *local_20;
  char *p;
  char *s_local;
  
  local_20 = s;
  while( true ) {
    if (*local_20 == '\0') {
      return false;
    }
    if ((*local_20 == '\r') || (*local_20 == '\n')) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

inline bool has_crlf(const char *s) {
			auto p = s;
			while (*p) {
				if (*p == '\r' || *p == '\n') { return true; }
				p++;
			}
			return false;
		}